

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<long_double>(longdouble t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000039;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  shared_ptr<long_double> p;
  undefined1 local_61;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_60;
  element_type *local_58;
  shared_ptr<long_double> local_50;
  Any local_40;
  undefined *local_38;
  undefined4 local_30;
  longdouble local_28;
  
  local_28 = t;
  std::make_shared<long_double,long_double>((longdouble *)&local_50);
  local_58 = local_50.super___shared_ptr<long_double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&long_double::typeinfo;
  local_38 = &long_double::typeinfo;
  local_30 = 0x10;
  detail::Any::Any<std::shared_ptr<long_double>,void>((Any *)&local_60,&local_50);
  local_61 = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,long_double*&,bool&>
            ((Type_Info *)CONCAT71(in_register_00000039,t_return_value),&local_40,(bool *)&local_60,
             (longdouble **)&local_61,(bool *)&local_58);
  if (local_60._M_head_impl != (Data *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Data[1])();
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<long_double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT71(in_register_00000039,t_return_value);
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }